

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O0

int archive_read_open_fd(archive *a,int fd,size_t block_size)

{
  int iVar1;
  int *piVar2;
  void *__ptr;
  void *b;
  read_fd_data *mine;
  stat st;
  size_t block_size_local;
  int fd_local;
  archive *a_local;
  
  st.__glibc_reserved[2] = block_size;
  archive_clear_error(a);
  iVar1 = fstat(fd,(stat *)&mine);
  if (iVar1 == 0) {
    piVar2 = (int *)calloc(1,0x28);
    __ptr = malloc(st.__glibc_reserved[2]);
    if ((piVar2 == (int *)0x0) || (__ptr == (void *)0x0)) {
      archive_set_error(a,0xc,"No memory");
      free(piVar2);
      free(__ptr);
      a_local._4_4_ = -0x1e;
    }
    else {
      *(__syscall_slong_t *)(piVar2 + 2) = st.__glibc_reserved[2];
      *(void **)(piVar2 + 8) = __ptr;
      *piVar2 = fd;
      if (((uint)st.st_nlink & 0xf000) == 0x8000) {
        archive_read_extract_set_skip_file(a,(la_int64_t)mine,st.st_dev);
        *(undefined1 *)(piVar2 + 6) = 1;
        *(__dev_t *)(piVar2 + 4) = st.st_rdev;
      }
      archive_read_set_read_callback(a,file_read);
      archive_read_set_skip_callback(a,file_skip);
      archive_read_set_seek_callback(a,file_seek);
      archive_read_set_close_callback(a,file_close);
      archive_read_set_callback_data(a,piVar2);
      a_local._4_4_ = archive_read_open1(a);
    }
  }
  else {
    piVar2 = __errno_location();
    archive_set_error(a,*piVar2,"Can\'t stat fd %d",(ulong)(uint)fd);
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

int
archive_read_open_fd(struct archive *a, int fd, size_t block_size)
{
	struct stat st;
	struct read_fd_data *mine;
	void *b;

	archive_clear_error(a);
	if (fstat(fd, &st) != 0) {
		archive_set_error(a, errno, "Can't stat fd %d", fd);
		return (ARCHIVE_FATAL);
	}

	mine = calloc(1, sizeof(*mine));
	b = malloc(block_size);
	if (mine == NULL || b == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		free(mine);
		free(b);
		return (ARCHIVE_FATAL);
	}
	mine->block_size = block_size;
	mine->buffer = b;
	mine->fd = fd;
	/*
	 * Skip support is a performance optimization for anything
	 * that supports lseek().  On FreeBSD, only regular files and
	 * raw disk devices support lseek() and there's no portable
	 * way to determine if a device is a raw disk device, so we
	 * only enable this optimization for regular files.
	 */
	if (S_ISREG(st.st_mode)) {
		archive_read_extract_set_skip_file(a, st.st_dev, st.st_ino);
		mine->use_lseek = 1;
		mine->size = st.st_size;
	}
#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(mine->fd, O_BINARY);
#endif

	archive_read_set_read_callback(a, file_read);
	archive_read_set_skip_callback(a, file_skip);
	archive_read_set_seek_callback(a, file_seek);
	archive_read_set_close_callback(a, file_close);
	archive_read_set_callback_data(a, mine);
	return (archive_read_open1(a));
}